

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O2

void __thiscall
MutableArray::MutableArray(MutableArray *this,vector<Item,_std::allocator<Item>_> *init)

{
  (this->super_Array).super_Container.content.super__Vector_base<Item,_std::allocator<Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Array).super_Container.content.super__Vector_base<Item,_std::allocator<Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Array).super_Container.content.super__Vector_base<Item,_std::allocator<Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Array).length = 0;
  (this->super_Array).content.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Array).content.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Array).content.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Array).super_Container.super_Object._vptr_Object =
       (_func_int **)&PTR_serialize_00138980;
  std::vector<Item,_std::allocator<Item>_>::operator=(&(this->super_Array).content,init);
  this->length = (int)(((long)(init->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(init->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
                             super__Vector_impl_data._M_start) / 0x70);
  return;
}

Assistant:

MutableArray(vector<Item> init) {
	  this->content = init;
	  this->length = init.size();
  }